

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::choose<vk::VkFormat_const*,vk::VkFormat*>
          (Random *this,VkFormat *first,VkFormat *last,VkFormat *result,int numItems)

{
  int iVar1;
  int ndx;
  int max;
  
  max = 0;
  do {
    if (first == last) {
      return;
    }
    iVar1 = max;
    if (max < numItems) {
LAB_00448c93:
      result[iVar1] = *first;
    }
    else {
      iVar1 = getInt(this,0,max);
      if (iVar1 < numItems) goto LAB_00448c93;
    }
    first = first + 1;
    max = max + 1;
  } while( true );
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}